

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * parse_tokens_from_string(string *input,char delimiter)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  char in_DL;
  string *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  string token;
  stringstream ss;
  vector<int,_std::allocator<int>_> *output;
  size_t *in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  vector<int,_std::allocator<int>_> *this;
  string local_1d0 [48];
  stringstream local_1a0 [398];
  byte local_12;
  char local_11;
  string *local_10;
  
  local_12 = 0;
  this = in_RDI;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1f1f0a);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,local_10,_Var2);
  std::__cxx11::string::string(local_1d0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,local_1d0,local_11);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    in_stack_fffffffffffffe04 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe04);
    if (!bVar1) break;
    in_stack_fffffffffffffe00 =
         std::__cxx11::stoi((string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            in_stack_fffffffffffffdf8,0);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (value_type_conflict6 *)in_stack_fffffffffffffdf8);
  }
  local_12 = 1;
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  if ((local_12 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(this);
  }
  return in_RDI;
}

Assistant:

static std::vector<gpt_vocab::id> parse_tokens_from_string(const std::string& input, char delimiter) {
    std::vector<gpt_vocab::id> output;
    std::stringstream ss(input);
    std::string token;

    while (std::getline(ss, token, delimiter)) {
        output.push_back(std::stoi(token));
    }

    return output;
}